

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::AggressiveDCEPass::BlockIsInConstruct
          (AggressiveDCEPass *this,BasicBlock *header_block,BasicBlock *bb)

{
  uint32_t uVar1;
  IRContext *this_00;
  StructuredCFGAnalysis *this_01;
  uint32_t local_2c;
  uint32_t current_header;
  BasicBlock *bb_local;
  BasicBlock *header_block_local;
  AggressiveDCEPass *this_local;
  
  if ((bb != (BasicBlock *)0x0) && (header_block != (BasicBlock *)0x0)) {
    for (local_2c = BasicBlock::id(bb); local_2c != 0;
        local_2c = StructuredCFGAnalysis::ContainingConstruct(this_01,local_2c)) {
      uVar1 = BasicBlock::id(header_block);
      if (local_2c == uVar1) {
        return true;
      }
      this_00 = Pass::context((Pass *)this);
      this_01 = IRContext::GetStructuredCFGAnalysis(this_00);
    }
  }
  return false;
}

Assistant:

bool AggressiveDCEPass::BlockIsInConstruct(BasicBlock* header_block,
                                           BasicBlock* bb) {
  if (bb == nullptr || header_block == nullptr) {
    return false;
  }

  uint32_t current_header = bb->id();
  while (current_header != 0) {
    if (current_header == header_block->id()) return true;
    current_header = context()->GetStructuredCFGAnalysis()->ContainingConstruct(
        current_header);
  }
  return false;
}